

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

uint pugi::impl::anon_unknown_0::string_to_integer<unsigned_int>(char_t *value,uint minv,uint maxv)

{
  byte bVar1;
  byte *pbVar2;
  uint local_80;
  uint local_7c;
  bool local_75;
  bool local_71;
  size_t high_bit;
  char_t max_lead;
  size_t max_digits10;
  size_t digits_1;
  char_t *start_1;
  size_t digits;
  char_t *start;
  bool overflow;
  byte *pbStack_30;
  bool negative;
  char_t *s;
  uint result;
  uint maxv_local;
  uint minv_local;
  char_t *value_local;
  
  s._4_4_ = 0;
  pbStack_30 = (byte *)value;
  while (((anonymous_namespace)::chartype_table[*pbStack_30] & 8) != 0) {
    pbStack_30 = pbStack_30 + 1;
  }
  bVar1 = *pbStack_30;
  local_71 = true;
  if (*pbStack_30 != 0x2b) {
    local_71 = *pbStack_30 == 0x2d;
  }
  pbStack_30 = pbStack_30 + (int)(uint)local_71;
  if ((*pbStack_30 == 0x30) && ((pbStack_30[1] | 0x20) == 0x78)) {
    for (pbStack_30 = pbStack_30 + 2; pbVar2 = pbStack_30, *pbStack_30 == 0x30;
        pbStack_30 = pbStack_30 + 1) {
    }
    do {
      if ((int)(char)*pbStack_30 - 0x30U < 10) {
        s._4_4_ = s._4_4_ * 0x10 + (char)*pbStack_30 + -0x30;
      }
      else {
        if (5 < ((int)(char)*pbStack_30 | 0x20U) - 0x61) goto LAB_001578bd;
        s._4_4_ = s._4_4_ * 0x10 + (((int)(char)*pbStack_30 | 0x20U) - 0x57);
      }
      pbStack_30 = pbStack_30 + 1;
    } while( true );
  }
  for (; pbVar2 = pbStack_30, *pbStack_30 == 0x30; pbStack_30 = pbStack_30 + 1) {
  }
  for (; (int)(char)*pbStack_30 - 0x30U < 10; pbStack_30 = pbStack_30 + 1) {
    s._4_4_ = s._4_4_ * 10 + (char)*pbStack_30 + -0x30;
  }
  local_75 = false;
  if (9 < (ulong)((long)pbStack_30 - (long)pbVar2)) {
    local_75 = false;
    if (((long)pbStack_30 - (long)pbVar2 == 10) && (local_75 = true, '3' < (char)*pbVar2)) {
      local_75 = *pbVar2 == 0x34 && (int)s._4_4_ < 0;
    }
    local_75 = (bool)(local_75 ^ 1);
  }
LAB_001579be:
  if (bVar1 == 0x2d) {
    local_7c = minv;
    if ((!local_75) && (s._4_4_ <= -minv)) {
      local_7c = -s._4_4_;
    }
    value_local._4_4_ = local_7c;
  }
  else {
    local_80 = maxv;
    if ((!local_75) && (s._4_4_ <= maxv)) {
      local_80 = s._4_4_;
    }
    value_local._4_4_ = local_80;
  }
  return value_local._4_4_;
LAB_001578bd:
  local_75 = 8 < (ulong)((long)pbStack_30 - (long)pbVar2);
  goto LAB_001579be;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}